

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::SearchCompoundNoClear(BoardView *this,char *item)

{
  bool bVar1;
  char *in_RSI;
  long in_RDI;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *unaff_retaddr;
  BoardView *in_stack_00000080;
  char *in_stack_00000098;
  BoardView *in_stack_000000a0;
  int in_stack_0000390c;
  BoardView *in_stack_00003910;
  
  if (*in_RSI != '\0') {
    if ((*(byte *)(in_RDI + 0xd1b8) & 1) != 0) {
      fprintf(_stderr,"Searching for \'%s\'\n",in_RSI);
    }
    if ((*(byte *)(in_RDI + 0xd6aa) & 1) != 0) {
      FindComponentNoClear(in_stack_000000a0,in_stack_00000098);
    }
    if ((*(byte *)(in_RDI + 0xd6ab) & 1) != 0) {
      FindNetNoClear(in_stack_000000a0,in_stack_00000098);
    }
    bVar1 = std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            empty(unaff_retaddr);
    if (((!bVar1) &&
        (bVar1 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::empty
                           ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                            unaff_retaddr), !bVar1)) &&
       (bVar1 = AnyItemVisible(in_stack_00000080), !bVar1)) {
      FlipBoard(in_stack_00003910,in_stack_0000390c);
    }
  }
  return;
}

Assistant:

void BoardView::SearchCompoundNoClear(const char *item) {
	if (*item == '\0') return;
	if (debug) fprintf(stderr, "Searching for '%s'\n", item);
	if (m_searchComponents) FindComponentNoClear(item);
	if (m_searchNets) FindNetNoClear(item);
	if (!m_partHighlighted.empty() && !m_pinHighlighted.empty() && !AnyItemVisible())
		FlipBoard(1); // passing 1 to override flipBoard parameter
}